

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O0

void __thiscall Alignment::Alignment(Alignment *this,string *path)

{
  bool bVar1;
  ostream *this_00;
  string *in_RSI;
  long in_RDI;
  bool flag;
  VecVector3d *in_stack_00000468;
  VecVector3d *in_stack_00000470;
  string *in_stack_00000478;
  long local_70;
  long local_48;
  string local_40 [35];
  undefined1 local_1d;
  
  local_48 = in_RDI;
  do {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1b5529);
    local_48 = local_48 + 0x18;
  } while (local_48 != in_RDI + 0x30);
  local_70 = in_RDI + 0x30;
  do {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1b556c);
    local_70 = local_70 + 0x18;
  } while (local_70 != in_RDI + 0x60);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1b5594);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x1b55ac);
  std::__cxx11::string::string(local_40,in_RSI);
  bVar1 = ReadLinsData(in_stack_00000478,in_stack_00000470,in_stack_00000468);
  std::__cxx11::string::~string(local_40);
  if (!bVar1) {
    local_1d = bVar1;
    this_00 = std::operator<<((ostream *)&std::cout,"read file error!!!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

Alignment::Alignment(const string path)
{
    bool flag = ReadLinsData(path, this->OriginData[0], this->OriginData[1]);
    if(!flag)
        cout << "read file error!!!" << endl;
}